

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>
::InnerMap::InsertUniqueInList
          (iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  Node *pNVar3;
  
  ppNVar2 = (Node **)(this->table_ + b);
  pNVar1 = *ppNVar2;
  pNVar3 = pNVar1;
  if ((pNVar1 != (Node *)0x0) && (6 < (this->seed_ ^ (ulong)node) % 0xd)) {
    pNVar3 = pNVar1->next;
    ppNVar2 = &pNVar1->next;
  }
  node->next = pNVar3;
  *ppNVar2 = node;
  __return_storage_ptr__->node_ = node;
  __return_storage_ptr__->m_ = this;
  __return_storage_ptr__->bucket_index_ = b;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInList(size_type b, Node* node) {
      if (table_[b] != nullptr && ShouldInsertAfterHead(node)) {
        Node* first = static_cast<Node*>(table_[b]);
        node->next = first->next;
        first->next = node;
        return iterator(node, this, b);
      }

      node->next = static_cast<Node*>(table_[b]);
      table_[b] = static_cast<void*>(node);
      return iterator(node, this, b);
    }